

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderMaxUniformBlocksTest::getShaderParts
          (GeometryShaderMaxUniformBlocksTest *this,GLchar ***out_fragment_shader_parts,
          uint *out_n_fragment_shader_parts,GLchar ***out_geometry_shader_parts,
          uint *out_n_geometry_shader_parts,GLchar ***out_vertex_shader_parts,
          uint *out_n_vertex_shader_parts)

{
  GLint *pGVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  ostream *poVar3;
  stringstream stream;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  GLchar ***local_1d0;
  uint *local_1c8;
  GLchar ***local_1c0;
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d0 = out_geometry_shader_parts;
  local_1c8 = out_n_geometry_shader_parts;
  local_1c0 = out_vertex_shader_parts;
  iVar2 = (*((this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  *out_fragment_shader_parts = &m_fragment_shader_code;
  *out_n_fragment_shader_parts = 1;
  pGVar1 = &this->m_max_uniform_blocks;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))
            ((this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.
             m_glExtTokens.MAX_GEOMETRY_UNIFORM_BLOCKS,pGVar1);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glGetIntegerv() call failed for GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x5db);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::ostream::operator<<((ostream *)local_1a8,this->m_max_uniform_blocks);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_max_uniform_blocks_string,(string *)&local_1f0)
  ;
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
  }
  this->m_geometry_shader_parts[0] =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout(points)                 in;\nlayout(points, max_vertices=1) out;\n\n// definition of NUMBER_OF_UNIFORMS goes here\n"
  ;
  this->m_geometry_shader_parts[1] = "#define NUMBER_OF_UNIFORM_BLOCKS ";
  this->m_geometry_shader_parts[2] = (this->m_max_uniform_blocks_string)._M_dataplus._M_p;
  this->m_geometry_shader_parts[3] =
       "u\n\nlayout(binding = 0) uniform UniformBlock\n{\n    int entry;\n} uni_block_array[NUMBER_OF_UNIFORM_BLOCKS];\n\nflat out int gs_out_sum;\n\nvoid main()\n{\n    gs_out_sum = 0;\n\n"
  ;
  local_1e8 = 0;
  local_1e0 = 0;
  local_1f0 = &local_1e0;
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
  }
  std::ios::clear((int)(stringstream *)local_1b8 + (int)*(undefined8 *)(local_1b8[0] + -0x18));
  if (0 < *pGVar1) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"    gs_out_sum += uni_block_array[",0x22);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"].entry;\n",9);
      iVar2 = iVar2 + 1;
    } while (iVar2 < *pGVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&this->m_uniform_block_access_string,(string *)&local_1f0);
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
  }
  this->m_geometry_shader_parts[4] = (this->m_uniform_block_access_string)._M_dataplus._M_p;
  this->m_geometry_shader_parts[5] = "\n    EmitVertex();\n\n    EndPrimitive();\n}\n";
  *local_1d0 = this->m_geometry_shader_parts;
  *local_1c8 = 6;
  *local_1c0 = &m_vertex_shader_code;
  *out_n_vertex_shader_parts = 1;
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void GeometryShaderMaxUniformBlocksTest::getShaderParts(const glw::GLchar* const*& out_fragment_shader_parts,
														unsigned int&			   out_n_fragment_shader_parts,
														const glw::GLchar* const*& out_geometry_shader_parts,
														unsigned int&			   out_n_geometry_shader_parts,
														const glw::GLchar* const*& out_vertex_shader_parts,
														unsigned int&			   out_n_vertex_shader_parts)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fragment Shader */
	out_fragment_shader_parts   = &m_fragment_shader_code;
	out_n_fragment_shader_parts = 1;

	/* Get maximum number of uniform blocks */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_UNIFORM_BLOCKS, &m_max_uniform_blocks);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT");

	std::stringstream stream;
	stream << m_max_uniform_blocks;
	m_max_uniform_blocks_string = stream.str();

	/* Geometry Shader */
	m_geometry_shader_parts[0] = m_geometry_shader_code_preamble;
	m_geometry_shader_parts[1] = m_geometry_shader_code_number_of_uniforms;
	m_geometry_shader_parts[2] = m_max_uniform_blocks_string.c_str();
	m_geometry_shader_parts[3] = m_geometry_shader_code_body_str;

	stream.str(std::string());
	stream.clear();
	for (glw::GLint uniform_block_nr = 0; uniform_block_nr < m_max_uniform_blocks; ++uniform_block_nr)
	{
		stream << "    gs_out_sum += uni_block_array[" << uniform_block_nr << "].entry;\n";
	}
	m_uniform_block_access_string = stream.str();

	m_geometry_shader_parts[4] = m_uniform_block_access_string.c_str();
	m_geometry_shader_parts[5] = m_geometry_shader_code_body_end;

	out_geometry_shader_parts   = m_geometry_shader_parts;
	out_n_geometry_shader_parts = 6;

	/* Vertex Shader */
	out_vertex_shader_parts   = &m_vertex_shader_code;
	out_n_vertex_shader_parts = 1;
}